

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O0

void __thiscall gl4cts::KHRDebug::TestBase::initDebug(TestBase *this)

{
  undefined8 platform_00;
  TestContext *pTVar1;
  RenderContext *pRVar2;
  CommandLine *pCVar3;
  ContextType local_5c;
  deUint32 local_58;
  ContextType local_54;
  undefined1 local_50 [8];
  RenderConfig renderCfg;
  Platform *platform;
  TestBase *this_local;
  
  pTVar1 = deqp::Context::getTestContext(this->m_test_base_context);
  renderCfg._48_8_ = tcu::TestContext::getPlatform(pTVar1);
  pRVar2 = deqp::Context::getRenderContext(this->m_test_base_context);
  local_5c.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  local_58 = (deUint32)glu::ContextType::getAPI(&local_5c);
  glu::ContextType::ContextType(&local_54,(ApiType)local_58,CONTEXT_DEBUG);
  glu::RenderConfig::RenderConfig((RenderConfig *)local_50,local_54);
  pTVar1 = deqp::Context::getTestContext(this->m_test_base_context);
  pCVar3 = tcu::TestContext::getCommandLine(pTVar1);
  glu::parseRenderConfig((RenderConfig *)local_50,pCVar3);
  platform_00 = renderCfg._48_8_;
  pTVar1 = deqp::Context::getTestContext(this->m_test_base_context);
  pCVar3 = tcu::TestContext::getCommandLine(pTVar1);
  pRVar2 = glu::createRenderContext((Platform *)platform_00,pCVar3,(RenderConfig *)local_50);
  this->m_rc = pRVar2;
  return;
}

Assistant:

void TestBase::initDebug()
{
	tcu::Platform&	platform = m_test_base_context.getTestContext().getPlatform();
	glu::RenderConfig renderCfg(
		glu::ContextType(m_test_base_context.getRenderContext().getType().getAPI(), glu::CONTEXT_DEBUG));

	parseRenderConfig(&renderCfg, m_test_base_context.getTestContext().getCommandLine());

	m_rc = createRenderContext(platform, m_test_base_context.getTestContext().getCommandLine(), renderCfg);
}